

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O0

ll_ftp_return_code_t ll_ftp_send_uplink(ll_ftp_t *f,size_t len)

{
  uint8_t uVar1;
  ll_ftp_return_code_t lVar2;
  ll_ftp_return_code_t ret;
  uint8_t old_max_port;
  size_t len_local;
  ll_ftp_t *f_local;
  
  uVar1 = ll_ul_max_port;
  ll_ul_max_port = 0x80;
  lVar2 = (*(f->cb).uplink)(f->tx_buf,(uint16_t)len,true,0x80);
  ll_ul_max_port = uVar1;
  gettime(&f->time_last_msg);
  return lVar2;
}

Assistant:

static ll_ftp_return_code_t ll_ftp_send_uplink(ll_ftp_t* f, size_t len)
{
    uint8_t old_max_port = ll_ul_max_port;
    ll_ul_max_port = LL_FTP_PORT;
    ll_ftp_return_code_t ret = f->cb.uplink(f->tx_buf, (uint16_t) len, true, LL_FTP_PORT);
    ll_ul_max_port = old_max_port;
    gettime(&f->time_last_msg);
    return ret;
}